

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

vector<BN,_std::allocator<BN>_> * __thiscall
BN::expBest_SlidePrecomp(vector<BN,_std::allocator<BN>_> *__return_storage_ptr__,BN *this,BN *mod)

{
  long lVar1;
  vector<BN,_std::allocator<BN>_> garr;
  BN mu;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  BN g;
  
  std::vector<BN,_std::allocator<BN>_>::vector(&garr,0x100,(allocator_type *)&mu);
  anon_unknown.dwarf_c68a::reductionBarrettPrecomputation(&mu,mod);
  reductionBarrett(&g,this,mod,&mu);
  bn1();
  operator=(garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
            _M_start,(BN *)&local_60);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
  operator=(garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
            _M_start + 1,&g);
  Qrt((BN *)&local_78,&g);
  reductionBarrett((BN *)&local_60,(BN *)&local_78,mod,&mu);
  operator=(garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
            _M_start + 2,(BN *)&local_60);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_78);
  for (lVar1 = 0x48; lVar1 != 0x1818; lVar1 = lVar1 + 0x30) {
    karatsubaMultiplication
              ((BN *)&local_78,
               (BN *)((long)&garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                             super__Vector_impl_data._M_start[-2].ba.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar1),
               garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start + 2);
    reductionBarrett((BN *)&local_60,(BN *)&local_78,mod,&mu);
    operator=((BN *)((long)&((garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                              super__Vector_impl_data._M_start)->ba).
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar1),(BN *)&local_60);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_78);
  }
  (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
  super__Vector_impl_data._M_start =
       garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  garr.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&g);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&mu);
  std::vector<BN,_std::allocator<BN>_>::~vector(&garr);
  return __return_storage_ptr__;
}

Assistant:

vector<BN> BN::expBest_SlidePrecomp(const BN& mod) const {
    vector <BN> garr (KarySize);
    BN mu = reductionBarrettPrecomputation(mod);
    BN g = this -> reductionBarrett(mod, mu);
    garr[0] = BN::bn1();
    garr[1] = g;
    garr[2] = g.Qrt().reductionBarrett(mod,mu);
    for(bt2 i = 1; i < KarySize/ 2; i++)
        garr[2 * i + 1] = (garr[2 * i - 1] * garr[2]).reductionBarrett(mod,mu);
    return move(garr);

}